

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_RequiresMixedFlags_Test::TestBody(TApp_RequiresMixedFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *opt;
  Option *this_01;
  long lVar3;
  allocator local_1c1;
  AssertHelper local_1c0;
  allocator local_1b2;
  allocator local_1b1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0 [4];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"--opt1",(allocator *)local_1b0);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_1c0);
  this_00 = &(this->super_TApp).app;
  opt = CLI::App::add_flag(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"--opt2",(allocator *)local_1b0);
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_1c0);
  CLI::App::add_flag(this_00,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_d0,"--opt3",(allocator *)local_1b0);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_1c0);
  CLI::App::add_flag(this_00,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"--optall",(allocator *)local_1b0);
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&local_1c0);
  this_01 = CLI::App::add_flag(this_00,&local_110,&local_130);
  CLI::Option::requires<CLI::Option*,char_const*,char_const*>(this_01,opt,"--opt2","--opt3");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--opt1",(allocator *)&local_1c0);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  std::__cxx11::string::~string((string *)local_1b0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--opt2",(allocator *)&local_1c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  std::__cxx11::string::~string((string *)local_1b0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--optall",(allocator *)&local_1c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  std::__cxx11::string::~string((string *)local_1b0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x44f,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_1b0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--optall",(allocator *)&local_1c0);
  std::__cxx11::string::string(local_190,"--opt1",&local_1c1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_170);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x453,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_1b0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--optall",(allocator *)&local_1c0);
  std::__cxx11::string::string(local_190,"--opt2",&local_1c1);
  std::__cxx11::string::string(local_170,"--opt1",&local_1b2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_150);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x457,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_1b0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_1b0,"--optall",(allocator *)&local_1c0);
  std::__cxx11::string::string(local_190,"--opt1",&local_1c1);
  std::__cxx11::string::string(local_170,"--opt2",&local_1b2);
  std::__cxx11::string::string(local_150,"--opt3",&local_1b1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             &local_130);
  lVar3 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiresMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, "--opt2", "--opt3");

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}